

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstorage.c
# Opt level: O0

void string_storage_init(string_storage *ss,size_t udbs)

{
  size_t udbs_local;
  string_storage *ss_local;
  
  (ss->sb).user_data_size = udbs;
  (ss->sb).used_bytes = 0;
  (ss->sb).current = (char *)0x0;
  (ss->sb).block_count = 0;
  (ss->sb).blocks = (char **)0x0;
  (ss->root).value = (char *)0x0;
  (ss->root).child_count = 0;
  (ss->root).children = (string_struct *)0x0;
  return;
}

Assistant:

void string_storage_init(string_storage *ss, size_t udbs)
{
	ss->sb.user_data_size = udbs;
	ss->sb.used_bytes = 0;
	ss->sb.current = 0;
	ss->sb.block_count = 0;
	ss->sb.blocks = 0;
	ss->root.value = 0;
	ss->root.child_count = 0;
	ss->root.children = 0;
}